

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O2

fy_token * fy_scan_peek(fy_parser *fyp)

{
  fy_token *pfVar1;
  int iVar2;
  int iVar3;
  fy_token *pfVar4;
  uint flags;
  char *fmt;
  
  if ((fyp->field_0x70 & 4) != 0) {
    pfVar1 = (fy_token *)(fyp->queued_tokens)._lh.next;
    if ((pfVar1 != (fy_token *)0x0 && pfVar1 != (fy_token *)&fyp->queued_tokens) &&
       (pfVar1->type == FYTT_STREAM_END)) {
      return pfVar1;
    }
    fy_token_list_unref_all(&fyp->queued_tokens);
    iVar2 = fy_parse_get_next_input(fyp);
    if (iVar2 < 0) {
      fmt = "fy_parse_get_next_input() failed";
      flags = 4;
      iVar2 = 0xea2;
      goto LAB_001316d2;
    }
    if (iVar2 == 0) {
      fmt = "token stream ends";
      flags = 0x20;
      iVar2 = 0xea6;
      goto LAB_001316d2;
    }
    fy_parser_diag(fyp,0x20,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0xeaa,"fy_scan_peek","starting new token stream");
    fyp->field_0x70 = fyp->field_0x70 & 0xf9;
  }
  do {
    pfVar1 = (fy_token *)(fyp->queued_tokens)._lh.next;
    pfVar4 = pfVar1;
    if (pfVar1 == (fy_token *)&fyp->queued_tokens) {
      pfVar4 = (fy_token *)0x0;
    }
    if ((pfVar4 != (fy_token *)0x0) && ((fyp->simple_keys)._lh.next == &(fyp->simple_keys)._lh)) {
      if (pfVar4->type != FYTT_STREAM_END) {
        if (pfVar4->type != FYTT_STREAM_START) {
          return pfVar1;
        }
        fy_parser_diag(fyp,0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,0xed0,"fy_scan_peek","setting stream_start_produced to true");
        fyp->field_0x70 = fyp->field_0x70 | 2;
        return pfVar1;
      }
      fy_parser_diag(fyp,0x20,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                     ,0xed4,"fy_scan_peek","setting stream_end_produced to true");
      fyp->field_0x70 = fyp->field_0x70 | 4;
      iVar2 = fy_parse_input_done(fyp);
      if (iVar2 == 0) {
        return pfVar1;
      }
      fmt = "fy_parse_input_done() failed";
      flags = 4;
      iVar2 = 0xed9;
      goto LAB_001316d2;
    }
    if ((fyp->field_0x70 & 0x10) != 0) {
      return (fy_token *)0x0;
    }
    iVar2 = fyp->token_activity_counter;
    iVar3 = fy_fetch_tokens(fyp);
    if (iVar3 != 0) {
      fmt = "fy_fetch_tokens() failed";
      flags = 4;
      iVar2 = 0xec8;
      goto LAB_001316d2;
    }
  } while (iVar2 != fyp->token_activity_counter);
  fmt = "out of tokens and failed to produce anymore";
  flags = 4;
  iVar2 = 0xecb;
LAB_001316d2:
  fy_parser_diag(fyp,flags,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                 ,iVar2,"fy_scan_peek",fmt);
  return (fy_token *)0x0;
}

Assistant:

struct fy_token *fy_scan_peek(struct fy_parser *fyp) {
    struct fy_token *fyt;
    int rc, last_token_activity_counter;
    bool have_simple_keys;

    /* nothing if stream end produced (and no stream end token in queue) */
    if (fyp->stream_end_produced) {
        fyt = fy_token_list_head(&fyp->queued_tokens);
        if (fyt && fyt->type == FYTT_STREAM_END)
            return fyt;

        /* OK, we're done, flush everything */
        fy_token_list_unref_all(&fyp->queued_tokens);

        /* try to get the next input */
        rc = fy_parse_get_next_input(fyp);
        fyp_error_check(fyp, rc >= 0, err_out,
                        "fy_parse_get_next_input() failed");

        /* no more inputs */
        if (rc == 0) {
            fyp_scan_debug(fyp, "token stream ends");
            return NULL;
        }

        fyp_scan_debug(fyp, "starting new token stream");

        fyp->stream_start_produced = false;
        fyp->stream_end_produced = false;
    }

    /* we loop until we have a token and the simple key list is empty */
    for (;;) {
        fyt = fy_token_list_head(&fyp->queued_tokens);
        have_simple_keys = !fy_simple_key_list_empty(&fyp->simple_keys);

        /* we can produce a token when:
		* a) one exists
		* b) no simple keys exist at all
		*/
        if (fyt && !have_simple_keys)
            break;

        /* on stream error we're done */
        if (fyp->stream_error)
            return NULL;

        /* keep track of token activity, if it didn't change
		* after the fetch tokens call, the state machine is stuck
		*/
        last_token_activity_counter = fyp->token_activity_counter;

        /* fetch more then */
        rc = fy_fetch_tokens(fyp);
        fyp_error_check(fyp, !rc, err_out,
                        "fy_fetch_tokens() failed");

        fyp_error_check(fyp, last_token_activity_counter != fyp->token_activity_counter, err_out,
                        "out of tokens and failed to produce anymore");
    }

    switch (fyt->type) {
        case FYTT_STREAM_START:
            fyp_scan_debug(fyp, "setting stream_start_produced to true");
            fyp->stream_start_produced = true;
            break;
        case FYTT_STREAM_END:
            fyp_scan_debug(fyp, "setting stream_end_produced to true");
            fyp->stream_end_produced = true;

            rc = fy_parse_input_done(fyp);
            fyp_error_check(fyp, !rc, err_out,
                            "fy_parse_input_done() failed");
            break;
        default:
            break;
    }

    return fyt;

    err_out:
    return NULL;
}